

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

IterateResult __thiscall gl4cts::GPUShaderFP64Test7::iterate(GPUShaderFP64Test7 *this)

{
  _variable_type output_variable_type;
  bool bVar1;
  NotSupportedError *pNVar2;
  long lVar3;
  uint uVar4;
  char *pcVar5;
  GPUShaderFP64Test7 *this_00;
  int iVar6;
  uint uVar7;
  _variable new_variable;
  _variables variables_to_test;
  _variable local_1cc;
  long local_1c0;
  undefined1 local_1b8 [8];
  iterator iStack_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [6];
  ios_base local_140 [272];
  
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_gpu_shader_fp64");
  if (!bVar1) {
    pNVar2 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_1b8 = (undefined1  [8])local_1a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b8,"GL_ARB_gpu_shader_fp64 is not supported.","");
    tcu::NotSupportedError::NotSupportedError(pNVar2,(string *)local_1b8);
    __cxa_throw(pNVar2,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  pcVar5 = "GL_ARB_vertex_attrib_64bit";
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_vertex_attrib_64bit")
  ;
  if (!bVar1) {
    pNVar2 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_1b8 = (undefined1  [8])local_1a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b8,"GL_ARB_vertex_attrib_64bit is not supported.","");
    tcu::NotSupportedError::NotSupportedError(pNVar2,(string *)local_1b8);
    __cxa_throw(pNVar2,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  initTest(this);
  lVar3 = 0;
  do {
    output_variable_type = (&DAT_01a44c80)[lVar3];
    uVar7 = 1;
    local_1c0 = lVar3;
    do {
      uVar4 = this->m_fs_id;
      getCodeOfFragmentShaderWithDoublePrecisionOutput_abi_cxx11_
                ((string *)local_1b8,(GPUShaderFP64Test7 *)pcVar5,output_variable_type,uVar7);
      this_00 = (GPUShaderFP64Test7 *)(ulong)uVar4;
      bVar1 = compileShader(this,uVar4,(string *)local_1b8);
      if (local_1b8 != (undefined1  [8])local_1a8) {
        this_00 = (GPUShaderFP64Test7 *)(local_1a8[0]._M_allocated_capacity + 1);
        operator_delete((void *)local_1b8,(ulong)this_00);
      }
      if (bVar1) {
        local_1b8 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&iStack_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&iStack_1b0,
                   "A fragment shader with double-precision output variable compiled successfully.",
                   0x4e);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        this_00 = (GPUShaderFP64Test7 *)&std::__cxx11::ostringstream::VTT;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&iStack_1b0);
        std::ios_base::~ios_base(local_140);
        this->m_has_test_passed = false;
      }
      uVar4 = this->m_fs_id;
      getCodeOfFragmentShaderWithNonFlatDoublePrecisionInput_abi_cxx11_
                ((string *)local_1b8,this_00,output_variable_type,uVar7);
      pcVar5 = (char *)(ulong)uVar4;
      bVar1 = compileShader(this,uVar4,(string *)local_1b8);
      if (local_1b8 != (undefined1  [8])local_1a8) {
        pcVar5 = (char *)(local_1a8[0]._M_allocated_capacity + 1);
        operator_delete((void *)local_1b8,(ulong)pcVar5);
      }
      if (bVar1) {
        local_1b8 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&iStack_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&iStack_1b0,
                   "A fragment shader with double-precision input variables lacking flat layout qualifier compiled successfully."
                   ,0x6c);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        pcVar5 = &std::__cxx11::ostringstream::VTT;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&iStack_1b0);
        std::ios_base::~ios_base(local_140);
        this->m_has_test_passed = false;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != 3);
    lVar3 = local_1c0 + 1;
  } while (lVar3 != 0xd);
  local_1b8 = (undefined1  [8])0x0;
  iStack_1b0._M_current = (_variable *)0x0;
  local_1a8[0]._M_allocated_capacity = (_variable *)0x0;
  uVar7 = 0;
  do {
    if (0 < this->m_n_max_components_per_stage) {
      iVar6 = 0;
      uVar4 = uVar7;
      while( true ) {
        local_1cc.array_size = (uVar4 & 1) + 1;
        local_1cc.type = (&DAT_01a44c80)[uVar4 >> 1];
        uVar7 = Utils::getNumberOfLocationsUsedByDoublePrecisionVariableType(local_1cc.type);
        iVar6 = iVar6 + uVar7 * local_1cc.array_size * 8;
        if (this->m_n_max_components_per_stage < iVar6) break;
        if (iStack_1b0._M_current == (_variable *)local_1a8[0]._0_8_) {
          std::
          vector<gl4cts::GPUShaderFP64Test7::_variable,std::allocator<gl4cts::GPUShaderFP64Test7::_variable>>
          ::_M_realloc_insert<gl4cts::GPUShaderFP64Test7::_variable_const&>
                    ((vector<gl4cts::GPUShaderFP64Test7::_variable,std::allocator<gl4cts::GPUShaderFP64Test7::_variable>>
                      *)local_1b8,iStack_1b0,&local_1cc);
        }
        else {
          (iStack_1b0._M_current)->type = local_1cc.type;
          (iStack_1b0._M_current)->attribute_location = local_1cc.attribute_location;
          (iStack_1b0._M_current)->array_size = local_1cc.array_size;
          iStack_1b0._M_current = iStack_1b0._M_current + 1;
        }
        uVar7 = uVar4 + 1;
        if ((this->m_n_max_components_per_stage <= iVar6) ||
           (bVar1 = uVar4 == 0x19, uVar4 = uVar7, bVar1)) goto LAB_00941775;
      }
      uVar7 = (this->m_n_max_components_per_stage < (int)(uVar7 * local_1cc.array_size * 8)) + uVar4
      ;
    }
LAB_00941775:
    if ((undefined1  [8])iStack_1b0._M_current != local_1b8) {
      bVar1 = executeFunctionalTest(this,(_variables *)local_1b8);
      this->m_has_test_passed = (bool)(this->m_has_test_passed & bVar1);
      if ((undefined1  [8])iStack_1b0._M_current != local_1b8) {
        iStack_1b0._M_current = (_variable *)local_1b8;
      }
    }
    if (uVar7 == 0x1a) {
      pcVar5 = "Fail";
      if (this->m_has_test_passed != QP_TEST_RESULT_PASS) {
        pcVar5 = "Pass";
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 this->m_has_test_passed ^ QP_TEST_RESULT_FAIL,pcVar5);
      if (local_1b8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_1b8,local_1a8[0]._M_allocated_capacity - (long)local_1b8);
      }
      return STOP;
    }
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult GPUShaderFP64Test7::iterate()
{
	/* Do not execute the test if GL_ARB_texture_view is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_gpu_shader_fp64"))
	{
		throw tcu::NotSupportedError("GL_ARB_gpu_shader_fp64 is not supported.");
	}

	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_vertex_attrib_64bit"))
	{
		throw tcu::NotSupportedError("GL_ARB_vertex_attrib_64bit is not supported.");
	}

	/* Initialize GL objects required to run the test */
	initTest();

	/* Check the negative cases first */
	const Utils::_variable_type double_variable_types[] = {
		Utils::VARIABLE_TYPE_DOUBLE,  Utils::VARIABLE_TYPE_DVEC2, Utils::VARIABLE_TYPE_DVEC3,
		Utils::VARIABLE_TYPE_DVEC4,   Utils::VARIABLE_TYPE_DMAT2, Utils::VARIABLE_TYPE_DMAT2X3,
		Utils::VARIABLE_TYPE_DMAT2X4, Utils::VARIABLE_TYPE_DMAT3, Utils::VARIABLE_TYPE_DMAT3X2,
		Utils::VARIABLE_TYPE_DMAT3X4, Utils::VARIABLE_TYPE_DMAT4, Utils::VARIABLE_TYPE_DMAT4X2,
		Utils::VARIABLE_TYPE_DMAT4X3,
	};
	const unsigned int n_double_variable_types = sizeof(double_variable_types) / sizeof(double_variable_types[0]);

	for (unsigned int n_double_variable_type = 0; n_double_variable_type < n_double_variable_types;
		 ++n_double_variable_type)
	{
		for (unsigned int array_size = 1; array_size < 3; ++array_size)
		{
			Utils::_variable_type variable_type = double_variable_types[n_double_variable_type];

			if (compileShader(m_fs_id, getCodeOfFragmentShaderWithDoublePrecisionOutput(variable_type, array_size)))
			{
				m_testCtx.getLog() << tcu::TestLog::Message
								   << "A fragment shader with double-precision output variable compiled successfully."
								   << tcu::TestLog::EndMessage;

				m_has_test_passed = false;
			}

			if (compileShader(m_fs_id,
							  getCodeOfFragmentShaderWithNonFlatDoublePrecisionInput(variable_type, array_size)))
			{
				m_testCtx.getLog()
					<< tcu::TestLog::Message
					<< "A fragment shader with double-precision input variables lacking flat layout qualifier"
					   " compiled successfully."
					<< tcu::TestLog::EndMessage;

				m_has_test_passed = false;
			}
		}
	} /* for (all variable types) */

	/* Execute functional test. Split the run into as many iterations as necessary
	 * so that we do not exceed GL implementation's capabilities. */
	unsigned int n_tested_variables = 0;
	_variables   variables_to_test;

	while (n_tested_variables != n_double_variable_types * 2 /* arrayed & non-arrayed */)
	{
		glw::GLint total_n_used_components = 0;

		/* Use as many variables as possible for the iterations. Do not exceed maximum amount
		 * of varying components that can be used for all shadr stages.
		 */
		while (total_n_used_components < m_n_max_components_per_stage &&
			   n_tested_variables != n_double_variable_types * 2 /* arrayed & non-arrayed */)
		{
			_variable	new_variable;
			unsigned int n_type_components = 0;
			glw::GLint   n_used_components = 0;

			new_variable.array_size =
				((n_tested_variables % 2) == 0) ? 1 /* non-arrayed variable */ : 2; /* arrayed variable */
			new_variable.type = double_variable_types[n_tested_variables / 2];

			/* Double-precision varyings can use twice as many components as single-precision FPs */
			n_type_components = 4 /* components per location */ *
								Utils::getNumberOfLocationsUsedByDoublePrecisionVariableType(new_variable.type);
			n_used_components = n_type_components * new_variable.array_size * 2;

			/* Do we have enough space? */
			if (total_n_used_components + n_used_components > m_n_max_components_per_stage)
			{
				if (n_used_components > m_n_max_components_per_stage)
				{ //if the number of components for this variable is larger than the max_components_per_stage, then skip it.
					n_tested_variables++;
				}
				break;
			}

			/* We can safely test the type in current iteration */
			total_n_used_components += n_used_components;
			n_tested_variables++;

			variables_to_test.push_back(new_variable);
		}

		if (variables_to_test.size() > 0)
		{
			m_has_test_passed &= executeFunctionalTest(variables_to_test);

			variables_to_test.clear();
		}
	}

	/* We're done */
	if (m_has_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}